

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

QString * __thiscall
Mustache::Renderer::render
          (QString *__return_storage_ptr__,Renderer *this,QString *_template,int startPos,int endPos
          ,Context *context)

{
  PartialResolver *pPVar1;
  QString *_template_00;
  QArrayData *pQVar2;
  CutResult CVar3;
  int iVar4;
  uint uVar5;
  QString *pQVar6;
  pointer pQVar7;
  QArrayData *pQVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  char16_t *pcVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QString tagStartMarker;
  QString tagEndMarker;
  Tag endTag;
  Tag tag;
  QString partialContent;
  QString local_178;
  QString *local_158;
  int local_14c;
  QString local_148;
  QArrayData *local_128;
  QArrayData *pQStack_120;
  char16_t *local_118;
  QString *local_108;
  QArrayData *local_100;
  QArrayData *pQStack_f8;
  char16_t *local_f0;
  int local_e0;
  int local_dc;
  Tag local_d0;
  Renderer *local_a0;
  QArrayData *local_98;
  QArrayData *pQStack_90;
  char16_t *local_88;
  QString local_78;
  Type local_54;
  QString *local_50;
  QString *local_48;
  QString *local_40;
  QString *local_38;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = &this->m_tagStartMarker;
  local_50 = &this->m_tagEndMarker;
  local_38 = &this->m_defaultTagStartMarker;
  local_40 = &this->m_defaultTagEndMarker;
  local_158 = __return_storage_ptr__;
  local_14c = endPos;
  local_108 = _template;
  local_a0 = this;
  do {
    if (this->m_errorPos != -1) {
      return local_158;
    }
    findTag(&local_d0,this,local_108,startPos,local_14c);
    local_100 = (QArrayData *)(long)startPos;
    local_54 = local_d0.type;
    if (local_d0.type == Null) {
      pcVar11 = (local_108->d).ptr;
      local_178.d.d = (Data *)(long)(local_14c - startPos);
      CVar3 = QtPrivate::QContainerImplHelper::mid
                        ((local_108->d).size,(qsizetype *)&local_100,(qsizetype *)&local_178);
      if (CVar3 == Null) {
        pcVar11 = (char16_t *)0x0;
      }
      else {
        pcVar11 = pcVar11 + (long)local_100;
      }
      QString::append((QChar *)local_158,(longlong)pcVar11);
    }
    else {
      pcVar11 = (local_108->d).ptr;
      local_178.d.d = (Data *)((long)local_d0.start - (long)local_100);
      CVar3 = QtPrivate::QContainerImplHelper::mid
                        ((local_108->d).size,(qsizetype *)&local_100,(qsizetype *)&local_178);
      if (CVar3 == Null) {
        pcVar11 = (char16_t *)0x0;
      }
      else {
        pcVar11 = pcVar11 + (long)local_100;
      }
      QString::append((QChar *)local_158,(longlong)pcVar11);
      switch(local_d0.type) {
      case Value:
        (*context->_vptr_Context[2])((Tag *)&local_100,context,&local_d0.key);
        if (local_d0.escapeMode == Unescape) {
          unescapeHtml(&local_178,(QString *)&local_100);
LAB_001173fa:
          pcVar11 = local_f0;
          pQVar2 = pQStack_f8;
          pQVar8 = local_100;
          local_100 = &(local_178.d.d)->super_QArrayData;
          local_178.d.d = (Data *)pQVar8;
          pQStack_f8 = (QArrayData *)local_178.d.ptr;
          local_f0 = (char16_t *)local_178.d.size;
          local_178.d.ptr = (char16_t *)pQVar2;
          local_178.d.size = (qsizetype)pcVar11;
          if (pQVar8 != (QArrayData *)0x0) {
            LOCK();
            (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar8,2,8);
            }
          }
        }
        else if (local_d0.escapeMode == Escape) {
          escapeHtml(&local_178,(QString *)&local_100);
          goto LAB_001173fa;
        }
        QString::append((QString *)local_158);
        startPos = local_d0.end;
        if (local_100 != (QArrayData *)0x0) {
          LOCK();
          (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar4 = (local_100->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar8 = local_100;
joined_r0x001173e0:
          if (iVar4 == 0) {
            QArrayData::deallocate(pQVar8,2,8);
          }
        }
        break;
      case SectionStart:
        findEndTag((Tag *)&local_100,this,local_108,&local_d0,local_14c);
        _template_00 = local_108;
        if ((Type)local_100 == Null) {
          if (this->m_errorPos == -1) {
            QVar18.m_data = (storage_type *)0x25;
            QVar18.m_size = (qsizetype)&local_178;
            QString::fromUtf8(QVar18);
            local_148.d.d = local_178.d.d;
            local_148.d.ptr = local_178.d.ptr;
            local_148.d.size = local_178.d.size;
            setError(this,&local_148,local_d0.start);
            if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
              }
            }
          }
        }
        else {
          uVar5 = (*context->_vptr_Context[4])(context,&local_d0.key);
          if ((int)uVar5 < 1) {
            iVar4 = (*context->_vptr_Context[7])(context,&local_d0.key);
            if ((char)iVar4 == '\0') {
              iVar4 = (*context->_vptr_Context[3])(context,&local_d0.key);
              startPos = local_dc;
              if ((char)iVar4 == '\0') {
                (*context->_vptr_Context[5])(context,&local_d0.key,0xffffffff);
                render(&local_178,local_a0,_template_00,local_d0.end,local_e0,context);
                QString::append((QString *)local_158);
                if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                  }
                }
                (*context->_vptr_Context[6])(context);
                startPos = local_dc;
              }
            }
            else {
              QString::mid((longlong)&local_148,(longlong)_template_00);
              (*context->_vptr_Context[8])(&local_178,context,&local_d0.key,&local_148,local_a0);
              QString::append((QString *)local_158);
              if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                }
              }
              startPos = local_dc;
              if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
                  startPos = local_dc;
                }
              }
            }
          }
          else {
            uVar10 = 0;
            do {
              (*context->_vptr_Context[5])(context,&local_d0.key,uVar10);
              render(&local_178,local_a0,_template_00,local_d0.end,local_e0,context);
              QString::append((QString *)local_158);
              if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                }
              }
              (*context->_vptr_Context[6])(context);
              uVar9 = (int)uVar10 + 1;
              uVar10 = (ulong)uVar9;
              startPos = local_dc;
            } while (uVar5 != uVar9);
          }
        }
        this = local_a0;
        if (pQStack_f8 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_f8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQStack_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQStack_f8,2,8);
            this = local_a0;
          }
        }
        break;
      case InvertedSectionStart:
        findEndTag((Tag *)&local_100,this,local_108,&local_d0,local_14c);
        if ((Type)local_100 == Null) {
          if (this->m_errorPos == -1) {
            QVar17.m_data = (storage_type *)0x2e;
            QVar17.m_size = (qsizetype)&local_178;
            QString::fromUtf8(QVar17);
            local_148.d.d = local_178.d.d;
            local_148.d.ptr = local_178.d.ptr;
            local_148.d.size = local_178.d.size;
            setError(this,&local_148,local_d0.start);
            if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
              }
            }
          }
        }
        else {
          iVar4 = (*context->_vptr_Context[3])(context,&local_d0.key);
          startPos = local_dc;
          if ((char)iVar4 != '\0') {
            render(&local_178,this,local_108,local_d0.end,local_e0,context);
            QString::append((QString *)local_158);
            startPos = local_dc;
            if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
                startPos = local_dc;
              }
            }
          }
        }
        if (pQStack_f8 != (QArrayData *)0x0) {
          LOCK();
          (pQStack_f8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQStack_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar4 = (pQStack_f8->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar8 = pQStack_f8;
          goto joined_r0x001173e0;
        }
        break;
      case SectionEnd:
        QVar12.m_data = (storage_type *)0x12;
        QVar12.m_size = (qsizetype)&local_100;
        QString::fromUtf8(QVar12);
        local_178.d.d = (Data *)local_100;
        local_178.d.ptr = (char16_t *)pQStack_f8;
        local_178.d.size = (qsizetype)local_f0;
        setError(this,&local_178,local_d0.start);
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
          }
        }
      case Comment:
      case SetDelimiter:
        startPos = local_d0.end;
        break;
      case Partial:
        local_178.d.d = (this->m_tagStartMarker).d.d;
        local_178.d.ptr = (this->m_tagStartMarker).d.ptr;
        local_178.d.size = (this->m_tagStartMarker).d.size;
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_148.d.d = (this->m_tagEndMarker).d.d;
        local_148.d.ptr = (this->m_tagEndMarker).d.ptr;
        local_148.d.size = (this->m_tagEndMarker).d.size;
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_148.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_148.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::operator=(local_48,(QString *)local_38);
        QString::operator=(local_50,(QString *)local_40);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this,
                   (this->m_partialStack).super_QList<QString>.d.size,&local_d0.key);
        pPVar1 = context->m_partialResolver;
        if (pPVar1 == (PartialResolver *)0x0) {
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = (char16_t *)0x0;
          local_78.d.size = 0;
        }
        else {
          (*pPVar1->_vptr_PartialResolver[2])(&local_78,pPVar1,&local_d0.key);
        }
        if (0 < local_d0.indentation) {
          QVar13.m_data = (storage_type *)0x1;
          QVar13.m_size = (qsizetype)&local_100;
          QString::fromUtf8(QVar13);
          local_98 = local_100;
          pQStack_90 = pQStack_f8;
          local_88 = local_f0;
          QString::repeated((longlong)&local_128);
          QString::append((QString *)local_158);
          if (local_128 != (QArrayData *)0x0) {
            LOCK();
            (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_128,2,8);
            }
          }
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,8);
            }
          }
          QVar14.m_data = (storage_type *)0x1;
          QVar14.m_size = (qsizetype)&local_100;
          QString::fromUtf8(QVar14);
          local_128 = local_100;
          pQStack_120 = pQStack_f8;
          local_118 = local_f0;
          uVar5 = QString::indexOf((QString *)&local_78,(longlong)&local_128,CaseInsensitive);
          while( true ) {
            if (local_128 != (QArrayData *)0x0) {
              LOCK();
              (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_128,2,8);
              }
            }
            if (((int)uVar5 < 1) || (local_78.d.size + -1 <= (long)(ulong)(uVar5 & 0x7fffffff)))
            break;
            QVar15.m_data = (storage_type *)0x1;
            QVar15.m_size = (qsizetype)&local_100;
            QString::fromUtf8(QVar15);
            local_98 = local_100;
            pQStack_90 = pQStack_f8;
            local_88 = local_f0;
            QString::repeated((longlong)&local_128);
            pQVar8 = pQStack_120;
            if (pQStack_120 == (QArrayData *)0x0) {
              pQVar8 = (QArrayData *)&QString::_empty;
            }
            pQVar6 = (QString *)
                     QString::insert((longlong)&local_78,(QChar *)(ulong)(uVar5 + CaseSensitive),
                                     (longlong)pQVar8);
            QString::operator=(&local_78,pQVar6);
            if (local_128 != (QArrayData *)0x0) {
              LOCK();
              (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_128,2,8);
              }
            }
            if (local_98 != (QArrayData *)0x0) {
              LOCK();
              (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_98,2,8);
              }
            }
            QVar16.m_data = (storage_type *)0x1;
            QVar16.m_size = (qsizetype)&local_100;
            QString::fromUtf8(QVar16);
            local_128 = local_100;
            pQStack_120 = pQStack_f8;
            local_118 = local_f0;
            uVar5 = QString::indexOf((QString *)&local_78,(longlong)&local_128,uVar5 + CaseSensitive
                                    );
          }
        }
        render((QString *)&local_100,this,&local_78,0,(int)local_78.d.size,context);
        QString::append((QString *)local_158);
        startPos = local_d0.end;
        pQVar7 = QList<QString>::data((QList<QString> *)this);
        pQVar8 = &(pQVar7[(this->m_partialStack).super_QList<QString>.d.size + -1].d.d)->
                  super_QArrayData;
        if (pQVar8 != (QArrayData *)0x0) {
          LOCK();
          (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QList<QString>::resize
                  ((QList<QString> *)this,(this->m_partialStack).super_QList<QString>.d.size + -1);
        if (pQVar8 != (QArrayData *)0x0) {
          LOCK();
          (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar8,2,8);
          }
        }
        QString::operator=(local_48,(QString *)&local_178);
        QString::operator=(local_50,(QString *)&local_148);
        if (local_100 != (QArrayData *)0x0) {
          LOCK();
          (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_100,2,8);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
          }
        }
        if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          iVar4 = ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar8 = &(local_178.d.d)->super_QArrayData;
          goto joined_r0x001173e0;
        }
      }
    }
    if (&(local_d0.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d0.key.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_54 == Null) {
      return local_158;
    }
  } while( true );
}

Assistant:

QString Renderer::render(const QString& _template, int startPos, int endPos, Context* context)
{
	QString output;
	int lastTagEnd = startPos;

	while (m_errorPos == -1) {
		Tag tag = findTag(_template, lastTagEnd, endPos);
		if (tag.type == Tag::Null) {
			output += QStringView(_template).mid(lastTagEnd, endPos - lastTagEnd);
			break;
		}
		output += QStringView(_template).mid(lastTagEnd, tag.start - lastTagEnd);
		switch (tag.type) {
		case Tag::Value:
		{
			QString value = context->stringValue(tag.key);
			if (tag.escapeMode == Tag::Escape) {
				value = escapeHtml(value);
			} else if (tag.escapeMode == Tag::Unescape) {
				value = unescapeHtml(value);
			}
			output += value;
			lastTagEnd = tag.end;
		}
		break;
		case Tag::SectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for section", tag.start);
				}
			} else {
				int listCount = context->listCount(tag.key);
				if (listCount > 0) {
					for (int i=0; i < listCount; i++) {
						context->push(tag.key, i);
						output += render(_template, tag.end, endTag.start, context);
						context->pop();
					}
				} else if (context->canEval(tag.key)) {
					output += context->eval(tag.key, _template.mid(tag.end, endTag.start - tag.end), this);
				} else if (!context->isFalse(tag.key)) {
					context->push(tag.key);
					output += render(_template, tag.end, endTag.start, context);
					context->pop();
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::InvertedSectionStart:
		{
			Tag endTag = findEndTag(_template, tag, endPos);
			if (endTag.type == Tag::Null) {
				if (m_errorPos == -1) {
					setError("No matching end tag found for inverted section", tag.start);
				}
			} else {
				if (context->isFalse(tag.key)) {
					output += render(_template, tag.end, endTag.start, context);
				}
				lastTagEnd = endTag.end;
			}
		}
		break;
		case Tag::SectionEnd:
			setError("Unexpected end tag", tag.start);
			lastTagEnd = tag.end;
			break;
		case Tag::Partial:
		{
			QString tagStartMarker = m_tagStartMarker;
			QString tagEndMarker = m_tagEndMarker;

			m_tagStartMarker = m_defaultTagStartMarker;
			m_tagEndMarker = m_defaultTagEndMarker;

			m_partialStack.push(tag.key);

			QString partialContent = context->partialValue(tag.key);

			// If there is a need to add a special indentation to the partial
			if (tag.indentation > 0) {
				output += QString(" ").repeated(tag.indentation);
				// Indenting the output to keep the parent indentation.
				int posOfLF = partialContent.indexOf("\n", 0);
				while (posOfLF > 0 && posOfLF < (partialContent.length() - 1)) { // .length() - 1 because we dont want indentation AFTER the last character if it's a LF
					partialContent = partialContent.insert(posOfLF + 1, QString(" ").repeated(tag.indentation));
					posOfLF = partialContent.indexOf("\n", posOfLF + 1);
				}
			}

			QString partialRendered = render(partialContent, 0, partialContent.length(), context);

			output += partialRendered;

			lastTagEnd = tag.end;

			m_partialStack.pop();

			m_tagStartMarker = tagStartMarker;
			m_tagEndMarker = tagEndMarker;
		}
		break;
		case Tag::SetDelimiter:
			lastTagEnd = tag.end;
			break;
		case Tag::Comment:
			lastTagEnd = tag.end;
			break;
		case Tag::Null:
			break;
		}
	}

	return output;
}